

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterT.hh
# Opt level: O0

void __thiscall
OpenMesh::IO::ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_>::set_color
          (ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_> *this,VertexHandle _vh,Vec4f *_color
          )

{
  AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *this_00;
  bool bVar1;
  return_type rVar2;
  Color local_27;
  BaseHandle local_24;
  VectorT<float,_4> *local_20;
  Vec4f *_color_local;
  ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_> *this_local;
  VertexHandle _vh_local;
  
  local_20 = _color;
  _color_local = (Vec4f *)this;
  this_local._4_4_ = _vh.super_BaseHandle.idx_;
  bVar1 = AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
          has_vertex_colors((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                             *)this->mesh_);
  if (bVar1) {
    this_00 = (AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *
              )this->mesh_;
    local_24.idx_ = this_local._4_4_;
    rVar2 = color_cast<OpenMesh::VectorT<unsigned_char,3>,OpenMesh::VectorT<float,4>>(local_20);
    local_27.super_VectorDataT<unsigned_char,_3>.values_._0_2_ =
         rVar2.super_VectorDataT<unsigned_char,_3>.values_._0_2_;
    local_27.super_VectorDataT<unsigned_char,_3>.values_[2] =
         rVar2.super_VectorDataT<unsigned_char,_3>.values_[2];
    AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::set_color
              (this_00,(VertexHandle)local_24.idx_,&local_27);
  }
  return;
}

Assistant:

virtual void set_color(VertexHandle _vh, const Vec4f& _color)
  {
    if (mesh_.has_vertex_colors())
      mesh_.set_color(_vh, color_cast<Color>(_color));
  }